

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall CPU::Z80::State::Registers::Registers(Registers *this)

{
  bool bVar1;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  Registers *local_10;
  Registers *this_local;
  
  local_10 = this;
  Reflection::StructImpl<CPU::Z80::State::Registers>::StructImpl
            (&this->super_StructImpl<CPU::Z80::State::Registers>);
  (this->super_StructImpl<CPU::Z80::State::Registers>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__00ca9858;
  bVar1 = Reflection::StructImpl<CPU::Z80::State::Registers>::needs_declare
                    (&this->super_StructImpl<CPU::Z80::State::Registers>);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"a",&local_41);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->a,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"flags",&local_69);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_char>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->flags,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"bc",&local_91);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->bc,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"de",&local_b9);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->de,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"hl",&local_e1);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->hl,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"af_dash",&local_109);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->af_dash,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"bc_dash",&local_131);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->bc_dash,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"de_dash",&local_159);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->de_dash,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"hl_dash",&local_181);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->hl_dash,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"ix",&local_1a9);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->ix,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"iy",&local_1d1);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->iy,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"ir",&local_1f9);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->ir,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"program_counter",&local_221);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->program_counter,&local_220
              );
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"stack_pointer",&local_249);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->stack_pointer,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"interrupt_mode",&local_271);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<int>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->interrupt_mode,&local_270)
    ;
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"iff1",&local_299);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<bool>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->iff1,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"iff2",&local_2c1);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<bool>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->iff2,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"memptr",&local_2e9);
    Reflection::StructImpl<CPU::Z80::State::Registers>::declare<unsigned_short>
              (&this->super_StructImpl<CPU::Z80::State::Registers>,&this->memptr,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
  }
  return;
}

Assistant:

State::Registers::Registers() {
	if(needs_declare()) {
		DeclareField(a);
		DeclareField(flags);
		DeclareField(bc);
		DeclareField(de);
		DeclareField(hl);
		DeclareField(af_dash);	// TODO: is there any disadvantage to declaring these for reflective
		DeclareField(bc_dash);	// purposes as AF', BC', etc?
		DeclareField(de_dash);
		DeclareField(hl_dash);
		DeclareField(ix);
		DeclareField(iy);
		DeclareField(ir);
		DeclareField(program_counter);
		DeclareField(stack_pointer);
		DeclareField(interrupt_mode);
		DeclareField(iff1);
		DeclareField(iff2);
		DeclareField(memptr);
	}
}